

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

void __thiscall ctemplate::TemplateCache::~TemplateCache(TemplateCache *this)

{
  unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
  *this_00;
  unordered_map<ctemplate::TemplateCache::RefcountedTemplate_*,_int,_ctemplate::TemplateCache::RefTplPtrHash,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>_>
  *this_01;
  Mutex *pMVar1;
  TemplateCache *this_local;
  
  ClearCache(this);
  this_00 = this->parsed_template_cache_;
  if (this_00 !=
      (unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
       *)0x0) {
    std::
    unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
    ::~unordered_map(this_00);
    operator_delete(this_00);
  }
  this_01 = this->get_template_calls_;
  if (this_01 !=
      (unordered_map<ctemplate::TemplateCache::RefcountedTemplate_*,_int,_ctemplate::TemplateCache::RefTplPtrHash,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>_>
       *)0x0) {
    std::
    unordered_map<ctemplate::TemplateCache::RefcountedTemplate_*,_int,_ctemplate::TemplateCache::RefTplPtrHash,_std::equal_to<ctemplate::TemplateCache::RefcountedTemplate_*>,_std::allocator<std::pair<ctemplate::TemplateCache::RefcountedTemplate_*const,_int>_>_>
    ::~unordered_map(this_01);
    operator_delete(this_01);
  }
  pMVar1 = this->mutex_;
  if (pMVar1 != (Mutex *)0x0) {
    Mutex::~Mutex(pMVar1);
    operator_delete(pMVar1);
  }
  pMVar1 = this->search_path_mutex_;
  if (pMVar1 != (Mutex *)0x0) {
    Mutex::~Mutex(pMVar1);
    operator_delete(pMVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->search_path_);
  return;
}

Assistant:

TemplateCache::~TemplateCache() {
  ClearCache();
  delete parsed_template_cache_;
  delete get_template_calls_;
  delete mutex_;
  delete search_path_mutex_;
}